

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

int output_instruction(Function *fn,Instruction *insn)

{
  TextBuffer *mb;
  char cVar1;
  SymbolType SVar2;
  LinearizerState *pLVar3;
  C_MemoryAllocator *pCVar4;
  InstructionList *pIVar5;
  BasicBlock **ppBVar6;
  Constant *pCVar7;
  FILE *__stream;
  int *piVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  C_Scope *pCVar12;
  C_Token *pCVar13;
  C_Obj *pCVar14;
  Pseudo *pPVar15;
  Pseudo *pPVar16;
  Pseudo *pPVar17;
  int *piVar18;
  Proc *pPVar19;
  C_Node *node;
  void *pvVar20;
  char *pcVar21;
  char *pcVar22;
  ProcList *pPVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  undefined8 uVar27;
  int *piVar28;
  char *pcVar29;
  int op;
  Proc *pPVar30;
  uint uVar31;
  bool bVar32;
  undefined8 uStack_270;
  C_Code_Analysis analysis;
  TextBuffer canned_code;
  C_MemoryAllocator allocator;
  TextBuffer saved;
  TextBuffer local_1d8;
  Pseudo src;
  char *local_48;
  
  (fn->tb).pos = 0;
  raviX_output_instruction(insn,&fn->tb);
  mb = &fn->body;
  raviX_buffer_add_fstring(mb,"// %s\n",(fn->tb).buf);
  (fn->tb).pos = 0;
  __stream = _stderr;
  uVar26 = (uint)*(byte *)insn;
  switch(*(byte *)insn) {
  case 1:
    iVar11 = raviX_ptrlist_size((PtrList *)fn->proc->procs);
    if (0 < iVar11) {
      raviX_buffer_add_string(mb,"{\nluaF_close(L, base, LUA_OK);\n");
      raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
      raviX_buffer_add_string(mb,"}\n");
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *stackbase = ci->func;\n");
    raviX_buffer_add_string(mb," int wanted = ci->nresults;\n");
    raviX_buffer_add_string(mb," result = wanted == -1 ? 0 : 1;\n");
    uVar26 = get_num_operands(insn);
    if ((int)uVar26 < 1) {
      pcVar21 = " int available = 0;\n";
LAB_0011e0c1:
      raviX_buffer_add_string(mb,pcVar21);
    }
    else {
      pPVar15 = get_operand(insn,uVar26 - 1);
      if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
        raviX_buffer_add_string(mb," int available = 0;\n");
        raviX_buffer_add_string(mb," {\n");
        raviX_buffer_add_string(mb,"  TValue *start_vararg = ");
        src.field_3.index_info.container = (Pseudo *)0x0;
        src.field_3.index_info.key = (Pseudo *)0x0;
        src.field_3._8_8_ = 0;
        src.field_3._16_8_ = 0;
        src.field_3.symbol = (LuaSymbol *)0x0;
        src._0_8_ = (ulong)*(uint *)pPVar15 & 0xffffffff000ffff0 | 4;
        emit_reg_accessor(fn,&src,0);
        raviX_buffer_add_string(mb," ;\n");
        raviX_buffer_add_fstring
                  (mb,"  available = (L->top - start_vararg) + %d;\n",(ulong)(uVar26 - 1));
        pcVar21 = " }\n";
        goto LAB_0011e0c1;
      }
      raviX_buffer_add_fstring(mb," int available = %d;\n",(ulong)uVar26);
    }
    raviX_buffer_add_string(mb," if (wanted == -1) wanted = available;\n");
    raviX_buffer_add_string(mb," int j = 0;\n");
    raviX_ptrlist_forward_iterator((PtrListIterator *)&allocator,(PtrList *)insn->operands);
    pPVar15 = (Pseudo *)raviX_ptrlist_iter_next((PtrListIterator *)&allocator);
    uVar26 = 0;
    while (pPVar15 != (Pseudo *)0x0) {
      if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
        uVar10 = compute_register_from_base(fn,pPVar15);
        raviX_buffer_add_fstring(mb," {\n int reg = %d;\n",(ulong)uVar10);
        raviX_buffer_add_string(mb,"  while (j < available) {\n");
        raviX_buffer_add_string(mb,"   TValue *dest_reg = S(j);\n");
        raviX_buffer_add_string(mb,"   TValue *src_reg = R(reg);\n");
        raviX_buffer_add_string
                  (mb,"   dest_reg->tt_ = src_reg->tt_; dest_reg->value_.gc = src_reg->value_.gc;\n"
                  );
        raviX_buffer_add_string(mb,"   j++, reg++;\n");
        raviX_buffer_add_string(mb,"  }\n");
        raviX_buffer_add_string(mb," }\n");
      }
      else {
        src.field_3.index_info.container = (Pseudo *)0x0;
        src.field_3.index_info.key = (Pseudo *)0x0;
        src.field_3._8_8_ = 0;
        src.field_3._16_8_ = 0;
        src._0_8_ = 0xd;
        src.field_3.index_info.key_type = 0;
        src.field_3.range_in_use = uVar26;
        raviX_buffer_add_fstring(mb," if (%d < available) {\n",(ulong)uVar26);
        emit_move(fn,pPVar15,&src);
        raviX_buffer_add_string(mb," }\n");
        raviX_buffer_add_fstring(mb," j++;\n");
        uVar26 = uVar26 + 1;
      }
      pPVar15 = (Pseudo *)raviX_ptrlist_iter_next((PtrListIterator *)&allocator);
    }
    raviX_buffer_add_string(mb," while (j < wanted) {\n");
    raviX_buffer_add_string(mb,"  setnilvalue(S(j));\n");
    raviX_buffer_add_string(mb,"  j++;\n");
    raviX_buffer_add_string(mb," }\n");
    raviX_buffer_add_string(mb," L->top = S(0) + wanted;\n");
    raviX_buffer_add_string(mb," L->ci = ci->previous;\n");
    raviX_buffer_add_string(mb,"}\n");
switchD_0011b842_caseD_49:
    pPVar15 = get_target(insn,0);
    emit_jump(fn,pPVar15);
    return 0;
  case 2:
  case 6:
  case 0xb:
    raviX_buffer_add_string(mb,"{\n");
    pPVar15 = get_target(insn,0);
    raviX_buffer_add_string(mb," TValue *ra = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n");
    cVar1 = *(char *)insn;
    if (cVar1 == '\x02') {
      pcVar21 = "TM_ADD";
      pcVar29 = "+";
    }
    else if (cVar1 == '\v') {
      pcVar21 = "TM_MUL";
      pcVar29 = "*";
    }
    else {
      if (cVar1 != '\x06') goto switchD_0011ba43_caseD_31;
      pcVar21 = "TM_SUB";
      pcVar29 = "-";
    }
    raviX_buffer_add_string(mb," TValue *rb = ");
    pPVar15 = get_operand(insn,0);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," TValue *rc = ");
    pPVar15 = get_operand(insn,1);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," lua_Integer i = 0;\n");
    raviX_buffer_add_string(mb," lua_Integer ic = 0;\n");
    raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
    raviX_buffer_add_string(mb," lua_Number nc = 0.0;\n");
    raviX_buffer_add_string(mb," if (ttisinteger(rb) && ttisinteger(rc)) {\n");
    raviX_buffer_add_string(mb,"  i = ivalue(rb);\n");
    raviX_buffer_add_string(mb,"  ic = ivalue(rc);\n");
    raviX_buffer_add_fstring(mb,"  setivalue(ra, (i %s ic));\n",pcVar29);
    raviX_buffer_add_string(mb," } else if (tonumberns(rb, n) && tonumberns(rc, nc)) {\n");
    raviX_buffer_add_fstring(mb,"  setfltvalue(ra, (n %s nc));\n",pcVar29);
    raviX_buffer_add_string(mb," } else {\n");
    raviX_buffer_add_fstring(mb,"  luaT_trybinTM(L, rb, rc, ra, %s);\n",pcVar21);
    raviX_buffer_add_string(mb,"  base = ci->u.l.base;\n");
    pcVar21 = " }\n";
    goto LAB_0011defd;
  case 3:
  case 5:
  case 7:
  case 10:
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x13:
  case 0x16:
  case 0x18:
  case 0x1a:
    raviX_buffer_add_string(mb,"{ ");
    pPVar15 = get_target(insn,0);
    if ((*(uint *)pPVar15 & 0xf) - 1 < 3) {
      emit_varname(fn,pPVar15);
      pcVar21 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar15,0);
      if ((*(byte *)insn < 0x11) && ((0x11088U >> (*(byte *)insn & 0x1f) & 1) != 0)) {
        pcVar21 = "; setfltvalue(dst_reg, ";
      }
      else {
        pcVar21 = "; setivalue(dst_reg, ";
      }
    }
    raviX_buffer_add_string(mb,pcVar21);
    bVar9 = *(char *)insn - 3;
    if ((0x17 < bVar9) || ((0xa92a95U >> (bVar9 & 0x1f) & 1) == 0)) {
switchD_0011ba43_caseD_31:
      pcVar21 = "Unexpected opcode";
LAB_0011e7e3:
      handle_error(fn,pcVar21);
LAB_0011e7eb:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                    ,0x848,"int emit_op_closure(Function *, Instruction *)");
    }
    iVar11 = *(int *)(&DAT_00138590 + (ulong)bVar9 * 4);
    pPVar16 = get_operand(insn,0);
    emit_varname_or_constant(fn,pPVar16);
    raviX_buffer_add_fstring(mb," %s ",&DAT_00138590 + iVar11);
    pPVar16 = get_operand(insn,1);
    emit_varname_or_constant(fn,pPVar16);
    uVar26 = *(uint *)pPVar15;
    pcVar29 = "; }\n";
    pcVar21 = "); }\n";
    goto LAB_0011bb2f;
  case 4:
  case 8:
  case 0xd:
  case 0x11:
    raviX_buffer_add_string(mb,"{ ");
    pPVar15 = get_target(insn,0);
    if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
      emit_varname(fn,pPVar15);
      pcVar21 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = "; setfltvalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar21);
    cVar1 = *(char *)insn;
    if (cVar1 == '\x04') {
      pcVar21 = "+";
    }
    else if (cVar1 == '\x11') {
      pcVar21 = "/";
    }
    else if (cVar1 == '\r') {
      pcVar21 = "*";
    }
    else {
      if (cVar1 != '\b') goto switchD_0011ba43_caseD_31;
      pcVar21 = "-";
    }
    pPVar16 = get_operand(insn,0);
    emit_varname_or_constant(fn,pPVar16);
    raviX_buffer_add_fstring(mb," %s ((lua_Number)(",pcVar21);
    pPVar16 = get_operand(insn,1);
    emit_varname_or_constant(fn,pPVar16);
    raviX_buffer_add_string(mb,"))");
    goto LAB_0011d97d;
  case 9:
  case 0x12:
    raviX_buffer_add_string(mb,"{ ");
    pPVar15 = get_target(insn,0);
    if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
      emit_varname(fn,pPVar15);
      pcVar21 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = "; setfltvalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar21);
    if (*(char *)insn == '\t') {
      pcVar21 = "-";
    }
    else {
      if (*(char *)insn != '\x12') goto switchD_0011ba43_caseD_31;
      pcVar21 = "/";
    }
    raviX_buffer_add_string(mb,"((lua_Number)(");
    pPVar16 = get_operand(insn,0);
    emit_varname_or_constant(fn,pPVar16);
    raviX_buffer_add_fstring(mb,")) %s ",pcVar21);
    pPVar16 = get_operand(insn,1);
    emit_varname_or_constant(fn,pPVar16);
LAB_0011d97d:
    bVar32 = ((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0x1;
LAB_0011d987:
    pcVar21 = "); }\n";
    if (bVar32) {
      pcVar21 = "; }\n";
    }
    goto LAB_0011e09e;
  case 0xf:
    uStack_270 = 5;
    break;
  case 0x14:
    uStack_270 = 6;
    break;
  case 0x15:
    uStack_270 = 7;
    break;
  case 0x17:
    uStack_270 = 8;
    break;
  case 0x19:
    uStack_270 = 9;
    break;
  case 0x1b:
    uStack_270 = 10;
    break;
  case 0x1c:
  case 0x1e:
    raviX_buffer_add_string(mb,"{\n ");
    pPVar15 = get_target(insn,0);
    if ((*(uint *)pPVar15 & 0xf) - 1 < 3) {
      emit_varname(fn,pPVar15);
      pcVar21 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = "; setivalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar21);
    raviX_buffer_add_string(mb,"luaV_shiftl(");
    pPVar16 = get_operand(insn,0);
    emit_varname_or_constant(fn,pPVar16);
    if (*(char *)insn == '\x1c') {
      pcVar21 = ", ";
    }
    else {
      if (*(char *)insn != '\x1e') goto switchD_0011ba43_caseD_31;
      pcVar21 = ", -";
    }
    raviX_buffer_add_string(mb,pcVar21);
    pPVar16 = get_operand(insn,1);
    emit_varname_or_constant(fn,pPVar16);
    raviX_buffer_add_string(mb,")");
    uVar26 = *(uint *)pPVar15;
    pcVar29 = ";\n}\n";
    pcVar21 = ");\n}\n";
LAB_0011bb2f:
    if ((uVar26 & 0xf) - 1 < 3) {
      pcVar21 = pcVar29;
    }
    goto LAB_0011e09e;
  case 0x1d:
    uStack_270 = 0xb;
    break;
  case 0x1f:
  case 0x22:
  case 0x25:
    pcVar21 = "==";
    if (uVar26 == 0x25) {
      pcVar21 = "<=";
    }
    pcVar29 = "<";
    if (uVar26 != 0x22) {
      pcVar29 = pcVar21;
    }
    pcVar21 = "luaV_lessequal";
    if (uVar26 == 0x22) {
      pcVar21 = "luaV_lessthan";
    }
    pcVar22 = "luaV_equalobj";
    if (uVar26 != 0x1f) {
      pcVar22 = pcVar21;
    }
    raviX_buffer_add_string(mb,"{\n int result = 0;\n");
    raviX_buffer_add_string(mb," TValue *rb = ");
    pPVar15 = get_operand(insn,0);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n TValue *rc = ");
    pPVar15 = get_operand(insn,1);
    emit_reg_accessor(fn,pPVar15,1);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," if (ttisinteger(rb) && ttisinteger(rc))\n");
    raviX_buffer_add_fstring(mb,"  result = (ivalue(rb) %s ivalue(rc));\n",pcVar29);
    raviX_buffer_add_string(mb," else {\n");
    raviX_buffer_add_fstring(mb,"  result = %s(L, rb, rc);\n  ",pcVar22);
    emit_reload_base(fn);
    raviX_buffer_add_string(mb," }\n");
    pPVar15 = get_first_target(insn);
    if ((*(uint *)pPVar15 & 0xf) == 3) {
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar15);
      pcVar21 = " = result != 0;\n";
    }
    else {
      if ((*(uint *)pPVar15 & 0xf) != 4) {
        handle_error_bad_pseudo(fn,pPVar15,"Unexpected pseudo");
      }
      raviX_buffer_add_string(mb," setbvalue(");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = ", result != 0);\n";
    }
    goto LAB_0011defd;
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
    raviX_buffer_add_string(mb,"{ ");
    pPVar15 = get_target(insn,0);
    if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0x3) {
      emit_varname(fn,pPVar15);
      pcVar21 = " = ";
    }
    else {
      raviX_buffer_add_string(mb,"TValue *dst_reg = ");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = "; setbvalue(dst_reg, ";
    }
    raviX_buffer_add_string(mb,pcVar21);
    bVar9 = *(char *)insn - 0x20;
    if ((7 < bVar9) || ((0xdbU >> (bVar9 & 0x1f) & 1) == 0)) goto switchD_0011ba43_caseD_31;
    iVar11 = *(int *)(&DAT_001385f0 + (ulong)bVar9 * 4);
    pPVar16 = get_operand(insn,0);
    emit_varname_or_constant(fn,pPVar16);
    raviX_buffer_add_fstring(mb," %s ",&DAT_001385f0 + iVar11);
    pPVar16 = get_operand(insn,1);
    emit_varname_or_constant(fn,pPVar16);
    bVar32 = ((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0x3;
    goto LAB_0011d987;
  case 0x28:
    uStack_270 = 3;
    break;
  case 0x29:
    uStack_270 = 4;
    break;
  case 0x2a:
    pPVar15 = get_first_operand(insn);
    pPVar16 = get_first_target(insn);
    if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) != (undefined1  [48])0x6) {
      __assert_fail("closure_pseudo->type == PSEUDO_PROC",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                    ,0x837,"int emit_op_closure(Function *, Instruction *)");
    }
    pPVar30 = (pPVar15->field_3).proc;
    raviX_ptrlist_forward_iterator((PtrListIterator *)&src,(PtrList *)pPVar30->parent->procs);
    pPVar19 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&src);
    uVar26 = 0;
    while (pPVar19 != (Proc *)0x0) {
      if (pPVar19->id == pPVar30->id) {
        if (pPVar19 != pPVar30) {
          __assert_fail("cursor == proc",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                        ,0x840,"int emit_op_closure(Function *, Instruction *)");
        }
        uVar10 = compute_register_from_base(fn,pPVar16);
        raviX_buffer_add_fstring
                  (mb,"raviV_op_closure(L, ci, cl, %d, %d);\n",(ulong)uVar10,(ulong)uVar26);
        emit_reload_base(fn);
        return 0;
      }
      uVar26 = uVar26 + 1;
      pPVar19 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&src);
    }
    goto LAB_0011e7eb;
  case 0x2b:
    pPVar15 = get_first_target(insn);
    pPVar16 = get_first_operand(insn);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
    raviX_buffer_add_string(mb," TValue *rb = ");
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," if (ttisinteger(rb)) {\n");
    raviX_buffer_add_string(mb,"  lua_Integer i = ivalue(rb);\n");
    raviX_buffer_add_string(mb,"  setivalue(ra, intop(-, 0, i));\n");
    raviX_buffer_add_string(mb," } else if (tonumberns(rb, n)) {\n");
    raviX_buffer_add_string(mb,"  setfltvalue(ra, luai_numunm(L, n));\n");
    raviX_buffer_add_string(mb," } else {\n");
    raviX_buffer_add_string(mb,"  luaT_trybinTM(L, rb, rb, ra, TM_UNM);\n");
    emit_reload_base(fn);
    goto LAB_0011d554;
  case 0x2c:
  case 0x2d:
    pPVar15 = get_first_target(insn);
    pPVar16 = get_first_operand(insn);
    bVar32 = *(char *)insn == ',';
    pcVar21 = "setfltvalue";
    if (bVar32) {
      pcVar21 = "setivalue";
    }
    pcVar29 = "setfltvalue";
    if (bVar32) {
      pcVar29 = "setivalue";
    }
    uVar26 = bVar32 + 1;
    raviX_buffer_add_string(mb,"{\n");
    if ((*(uint *)pPVar16 & 0xf) != 5 && (*(uint *)pPVar16 & 0xf) != uVar26) {
      raviX_buffer_add_string(mb," TValue *rb = ");
      emit_reg_accessor(fn,pPVar16,0);
      raviX_buffer_add_string(mb,";\n");
    }
    uVar10 = *(uint *)pPVar15 & 0xf;
    if (uVar10 == uVar26) {
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar15);
      raviX_buffer_add_string(mb," = -");
      if ((*(uint *)pPVar16 & 0xf) == 5 || (*(uint *)pPVar16 & 0xf) == uVar26) {
        emit_varname_or_constant(fn,pPVar16);
      }
      else {
        raviX_buffer_add_fstring(mb,"%s(rb)",pcVar29 + 3);
      }
      pcVar21 = ";\n";
    }
    else {
      if ((0xd < uVar10) || ((0x2011U >> uVar10 & 1) == 0)) {
        handle_error_bad_pseudo(fn,pPVar15,"Unexpected pseudo");
      }
      raviX_buffer_add_string(mb," TValue *ra = ");
      emit_reg_accessor(fn,pPVar15,0);
      raviX_buffer_add_fstring(mb,";\n %s(ra, ",pcVar21);
      if ((*(uint *)pPVar16 & 0xf) == 5 || (*(uint *)pPVar16 & 0xf) == uVar26) {
        emit_varname_or_constant(fn,pPVar16);
      }
      else {
        raviX_buffer_add_fstring(mb,"%s(rb)",pcVar29 + 3);
      }
      pcVar21 = ");\n";
    }
    goto LAB_0011defd;
  case 0x2e:
  case 0x2f:
    pPVar15 = get_first_operand(insn);
    pPVar16 = get_first_target(insn);
    raviX_buffer_add_string(mb,"{\n TValue *len = ");
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n TValue *obj = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n luaV_objlen(L, len, obj);\n");
    emit_reload_base(fn);
    if (((undefined1  [48])*pPVar16 & (undefined1  [48])0xf) == (undefined1  [48])0x2) {
      raviX_buffer_add_string(mb," ");
      emit_varname_or_constant(fn,pPVar16);
      pcVar21 = " = ival0.value_.i;\n";
      goto LAB_0011e08f;
    }
    goto LAB_0011e097;
  case 0x30:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    pPVar15 = get_first_target(insn);
    emit_reg_accessor(fn,pPVar15,0);
    switch(*(undefined1 *)insn) {
    case 0x30:
      raviX_buffer_add_string(mb,";\n lua_Integer i = 0;\n");
      uVar27 = 0;
      pcVar21 = " if (!tointegerns(ra, &i)) {\n";
      break;
    default:
      goto switchD_0011ba43_caseD_31;
    case 0x32:
      uVar27 = 0xf;
      pcVar21 = ";\n if (!ttisnil(ra) && !ttisclosure(ra)) {\n";
      break;
    case 0x33:
      uVar27 = 0xe;
      pcVar21 = ";\n if (!ttisnil(ra) && !ttisstring(ra)) {\n";
      break;
    case 0x34:
      uVar27 = 2;
      pcVar21 = ";\n if (!ttisiarray(ra)) {\n";
      break;
    case 0x35:
      uVar27 = 3;
      pcVar21 = ";\n if (!ttisfarray(ra)) {\n";
      break;
    case 0x36:
      uVar27 = 4;
      pcVar21 = ";\n if (!ttisLtable(ra)) {\n";
    }
    raviX_buffer_add_string(mb,pcVar21);
    goto LAB_0011d6dd;
  case 0x31:
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    pPVar15 = get_first_target(insn);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n lua_Number n = 0;\n");
    raviX_buffer_add_string
              (mb,
               " if (ttisnumber(ra)) { n = (ttisinteger(ra) ? (double) ivalue(ra) : fltvalue(ra)); setfltvalue(ra, n); }\n"
              );
    raviX_buffer_add_string(mb," else {\n");
    uVar27 = 1;
LAB_0011d6dd:
    raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",uVar27);
    raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
    pcVar21 = " }\n}\n";
    goto LAB_0011e09e;
  case 0x37:
    pPVar15 = get_first_operand(insn);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    pPVar16 = get_first_target(insn);
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n if (!ttisnil(ra)) {\n");
    raviX_buffer_add_string(mb,"  TValue *rb = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string
              (mb,"  if (!ttisshrstring(rb) || !raviV_check_usertype(L, tsvalue(rb), ra)) {\n");
    raviX_buffer_add_fstring(mb,"   raviX__error_code = %d;\n",0x10);
    raviX_buffer_add_string(mb,"   goto Lraise_error;\n");
    raviX_buffer_add_string(mb,"  }\n");
LAB_0011d554:
    pcVar21 = " }\n";
    goto LAB_0011e08f;
  case 0x38:
    pPVar15 = get_first_target(insn);
    pPVar16 = get_first_operand(insn);
    if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0x3) {
      if ((*(uint *)pPVar16 & 0xf) != 3) {
        if ((*(uint *)pPVar16 & 0xf) - 1 < 2) {
          __assert_fail("operand->type != PSEUDO_TEMP_FLT && operand->type != PSEUDO_TEMP_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                        ,0x8df,"int emit_op_not(Function *, Instruction *)");
        }
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *rb = ");
        pPVar16 = get_first_operand(insn);
        emit_reg_accessor(fn,pPVar16,0);
        raviX_buffer_add_string(mb,";\n ");
        emit_varname(fn,pPVar15);
        pcVar21 = " = l_isfalse(rb);\n}\n";
        goto LAB_0011e09e;
      }
      raviX_buffer_add_string(mb,"{ ");
      emit_varname(fn,pPVar15);
      raviX_buffer_add_string(mb," = (0 == ");
      emit_varname_or_constant(fn,pPVar16);
      pcVar21 = "); }\n";
      goto LAB_0011df0c;
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n TValue *rb = ");
    pPVar15 = get_first_operand(insn);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n int result = l_isfalse(rb);\n");
    pcVar21 = " setbvalue(ra, result);\n";
    goto LAB_0011e08f;
  case 0x39:
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    pPVar15 = get_first_target(insn);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n TValue *rb = ");
    pPVar15 = get_first_operand(insn);
    emit_reg_accessor(fn,pPVar15,0);
    pcVar21 = ";\n raviV_op_bnot(L, ra, rb);\n";
    goto LAB_0011d678;
  case 0x3a:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x58:
    pcVar29 = "luaV_gettable";
    if (uVar26 == 0x55) {
      pcVar29 = "raviV_gettable_sskey";
    }
    pcVar21 = "raviV_gettable_i";
    if (uVar26 != 0x54) {
      pcVar21 = pcVar29;
    }
    pPVar15 = get_operand(insn,0);
    pPVar16 = get_operand(insn,1);
    pPVar17 = get_target(insn,0);
    if (((((undefined1  [48])*pPVar16 & (undefined1  [48])0xf) == (undefined1  [48])0x5) &&
        (((pPVar16->field_3).constant)->type == 0x101)) &&
       (((((pPVar16->field_3).constant)->field_2).s)->len < 0x28)) {
      pcVar21 = "raviV_gettable_sskey";
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *tab = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n TValue *key = ");
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n TValue *dst = ");
    emit_reg_accessor(fn,pPVar17,1);
    pcVar29 = ";\n %s(L, tab, key, dst);\n ";
    goto LAB_0011c2e8;
  case 0x3b:
    pPVar15 = get_first_target(insn);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *ra = ");
    emit_reg_accessor(fn,pPVar15,0);
    pcVar21 = ";\n raviV_op_newtable(L, ci, ra, 0, 0);\n";
    goto LAB_0011d678;
  case 0x3c:
  case 0x3d:
    emit_op_newarray(fn,insn);
    return 0;
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x46:
  case 0x5a:
    pPVar15 = get_operand(insn,0);
    if (*(char *)insn == 'C') {
      pcVar21 = "raviV_settable_sskey";
    }
    else if (*(char *)insn == 'B') {
      if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0xb)
      goto LAB_0011bebc;
      pcVar21 = "raviV_settable_i";
    }
    else {
      pcVar21 = "luaV_settable";
    }
    pPVar16 = get_target(insn,0);
    pPVar17 = get_target(insn,1);
    if (((((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0x5) &&
        (((pPVar17->field_3).constant)->type == 0x101)) &&
       (((((pPVar17->field_3).constant)->field_2).s)->len < 0x28)) {
      pcVar21 = "raviV_settable_sskey";
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *tab = ");
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n TValue *key = ");
    emit_reg_accessor(fn,pPVar17,0);
    raviX_buffer_add_string(mb,";\n TValue *src = ");
    emit_reg_accessor(fn,pPVar15,1);
    pcVar29 = ";\n %s(L, tab, key, src);\n ";
LAB_0011c2e8:
    raviX_buffer_add_fstring(mb,pcVar29,pcVar21);
    emit_reload_base(fn);
    goto LAB_0011df05;
  case 0x45:
  case 0x47:
    bVar32 = uVar26 == 0x45;
    pcVar21 = "lua_Number *";
    if (bVar32) {
      pcVar21 = "lua_Integer *";
    }
    pcVar29 = "setfltvalue";
    if (bVar32) {
      pcVar29 = "setivalue";
    }
    pcVar22 = "raviH_set_float";
    if (bVar32) {
      pcVar22 = "raviH_set_int";
    }
    pPVar15 = get_target(insn,0);
    pPVar16 = get_target(insn,1);
    pPVar17 = get_operand(insn,0);
    if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
LAB_0011bebc:
      emit_store_range_to_table(fn,insn);
      return 0;
    }
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," RaviArray *arr = arrvalue(");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,");\n lua_Unsigned ukey = (lua_Unsigned) ");
    uVar26 = *(uint *)pPVar16 & 0xf;
    if (uVar26 == 0) {
      raviX_buffer_add_string(mb,"ivalue(");
      emit_reg_accessor(fn,pPVar16,0);
      raviX_buffer_add_string(mb,")");
    }
    else if (uVar26 == 2) {
      emit_varname(fn,pPVar16);
    }
    else {
      if (uVar26 != 5) goto LAB_0011e876;
      raviX_buffer_add_fstring(mb,"%lld",((pPVar16->field_3).proc)->nodes);
    }
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_fstring(mb," %siptr = (%s)arr->data;\n ",pcVar21,pcVar21);
    raviX_buffer_add_string(mb,"if (ukey < (lua_Unsigned)(arr->len)) {\n");
    raviX_buffer_add_string(mb," iptr[ukey] = ");
    uVar26 = *(uint *)pPVar17 & 0xf;
    if (uVar26 == bVar32 + 1) {
      emit_varname(fn,pPVar17);
    }
    else {
      if ((uVar26 != 0) && (uVar26 != 0xd)) {
        if (uVar26 == 5) {
          pCVar7 = (pPVar17->field_3).constant;
          if (pCVar7->type == 8) {
            raviX_buffer_add_fstring(mb,"%lld",(pCVar7->field_2).i);
          }
          else {
            raviX_buffer_add_fstring(mb,"%g",(int)(pCVar7->field_2).i);
          }
          goto LAB_0011e1dd;
        }
        if (uVar26 != 4) {
          pcVar21 = "Unexpected src pseudo";
          goto LAB_0011e7e3;
        }
      }
      raviX_buffer_add_fstring(mb,"%s(",pcVar29 + 3);
      emit_reg_accessor(fn,pPVar17,0);
      raviX_buffer_add_string(mb,")");
    }
LAB_0011e1dd:
    raviX_buffer_add_string(mb,";\n} else {\n");
    raviX_buffer_add_fstring(mb," %s(L, arr, ukey, ",pcVar22);
    uVar26 = *(uint *)pPVar17 & 0xf;
    if (uVar26 == bVar32 + 1) {
      emit_varname(fn,pPVar17);
    }
    else if ((uVar26 == 0) || (uVar26 == 0xd)) {
LAB_0011e230:
      raviX_buffer_add_fstring(mb,"%s(",pcVar29 + 3);
      emit_reg_accessor(fn,pPVar17,0);
      raviX_buffer_add_string(mb,")");
    }
    else if (uVar26 == 5) {
      pCVar7 = (pPVar17->field_3).constant;
      if (pCVar7->type == 8) {
        raviX_buffer_add_fstring(mb,"%lld",(pCVar7->field_2).i);
      }
      else {
        raviX_buffer_add_fstring(mb,"%g",(int)(pCVar7->field_2).i);
      }
    }
    else if (uVar26 == 4) goto LAB_0011e230;
    raviX_buffer_add_string(mb,");\n");
    pcVar21 = "}\n}\n";
    goto LAB_0011df0c;
  case 0x48:
    pPVar15 = get_operand(insn,0);
    switch(*(uint *)pPVar15 & 0xf) {
    case 0:
    case 4:
    case 0xc:
      raviX_buffer_add_string(mb,"{\nconst TValue *src_reg = ");
      emit_reg_accessor(fn,pPVar15,0);
      pPVar15 = get_target(insn,0);
      raviX_buffer_add_fstring
                (mb,";\nif (!l_isfalse(src_reg)) goto L%d;\n",
                 (ulong)((pPVar15->field_3).symbol)->symbol_type);
      pPVar15 = get_target(insn,1);
      SVar2 = ((pPVar15->field_3).symbol)->symbol_type;
      pcVar21 = "else goto L%d;\n";
      break;
    default:
      pcVar21 = "emit_op_cbr: Unexpected pseudo";
LAB_0011e815:
      handle_error_bad_pseudo(fn,pPVar15,pcVar21);
    case 3:
      raviX_buffer_add_string(mb,"{");
      raviX_buffer_add_string(mb," if (");
      emit_varname(fn,pPVar15);
      pPVar15 = get_target(insn,0);
      raviX_buffer_add_fstring
                (mb," != 0) goto L%d;",(ulong)((pPVar15->field_3).symbol)->symbol_type);
      pPVar15 = get_target(insn,1);
      SVar2 = ((pPVar15->field_3).symbol)->symbol_type;
      pcVar21 = " else goto L%d; ";
      break;
    case 5:
    case 8:
      goto switchD_0011b842_caseD_49;
    case 7:
    case 9:
      pPVar15 = get_target(insn,1);
      emit_jump(fn,pPVar15);
      return 0;
    }
    raviX_buffer_add_fstring(mb,pcVar21,(ulong)SVar2);
    goto LAB_0011e097;
  case 0x49:
    goto switchD_0011b842_caseD_49;
  case 0x4a:
  case 0x4b:
  case 0x4d:
    pPVar15 = get_operand(insn,0);
    pPVar16 = get_target(insn,0);
    iVar11 = emit_move(fn,pPVar15,pPVar16);
    return iVar11;
  case 0x4c:
    pPVar15 = get_first_target(insn);
    pPVar16 = get_first_operand(insn);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *rb = ");
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
    raviX_buffer_add_string(mb," if (!tonumberns(rb, n)) {\n");
    raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",1);
    raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
    raviX_buffer_add_string(mb," }\n");
    uVar26 = *(uint *)pPVar15 & 0xf;
    if (((uVar26 == 0) || (uVar26 == 0xd)) || (uVar26 == 4)) {
      raviX_buffer_add_string(mb," TValue *ra = ");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = ";\n setfltvalue(ra, n);\n";
    }
    else {
      if (uVar26 != 1) {
        pcVar21 = "Unexpected pseudo";
        goto LAB_0011e815;
      }
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar15);
      pcVar21 = " = n;\n";
    }
    goto LAB_0011defd;
  case 0x4e:
    pPVar15 = get_first_target(insn);
    pPVar16 = get_first_operand(insn);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," TValue *rb = ");
    emit_reg_accessor(fn,pPVar16,0);
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_string(mb," lua_Integer i = 0;\n");
    raviX_buffer_add_string(mb," if (!tointegerns(rb, &i)) {\n");
    raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",0);
    raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
    raviX_buffer_add_string(mb," }\n");
    uVar26 = *(uint *)pPVar15 & 0xf;
    if (((uVar26 == 0) || (uVar26 == 0xd)) || (uVar26 == 4)) {
      raviX_buffer_add_string(mb," TValue *ra = ");
      emit_reg_accessor(fn,pPVar15,0);
      pcVar21 = ";\n setivalue(ra, i);\n";
    }
    else {
      if (uVar26 != 2) {
        pcVar21 = "Unexpected target pseudo";
        goto LAB_0011e815;
      }
      raviX_buffer_add_string(mb," ");
      emit_varname(fn,pPVar15);
      pcVar21 = " = i;\n";
    }
    goto LAB_0011defd;
  case 0x4f:
    iVar11 = raviX_ptrlist_size((PtrList *)insn->targets);
    if (iVar11 != 2) {
      __assert_fail("get_num_targets(insn) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                    ,0x602,"int emit_op_call(Function *, Instruction *)");
    }
    uVar26 = get_num_operands(insn);
    uVar24 = (ulong)uVar26;
    pPVar15 = get_target(insn,0);
    if (((*(uint *)pPVar15 & 0xf) != 4) && ((*(uint *)pPVar15 & 0xf) != 0xb)) {
      __assert_fail("target_base->type == PSEUDO_TEMP_ANY || target_base->type == PSEUDO_RANGE",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                    ,0x608,"int emit_op_call(Function *, Instruction *)");
    }
    pPVar15 = get_target(insn,0);
    uVar10 = *(uint *)pPVar15;
    pPVar15 = get_target(insn,1);
    ppBVar6 = ((pPVar15->field_3).proc)->nodes;
    raviX_buffer_add_fstring
              (mb," if (stackoverflow(L,%d)) { luaD_growstack(L, %d); base = ci->u.l.base; }\n",
               (ulong)(uVar26 + 1));
    bVar32 = true;
    if (1 < uVar26) {
      uVar26 = uVar26 - 1;
      pPVar15 = get_operand(insn,uVar26);
      bVar32 = true;
      if ((*(uint *)pPVar15 & 0xf) == 0xb) {
        uVar25 = (uVar10 >> 4 & 0xffff) + uVar26;
        if ((*(uint *)pPVar15 >> 4 & 0xffff) == uVar25) {
          bVar32 = false;
          uVar24 = (ulong)uVar26;
        }
        else {
          raviX_buffer_add_string(mb,"{\n");
          raviX_buffer_add_string(mb," TValue *src_base = ");
          bVar32 = false;
          emit_reg_accessor(fn,pPVar15,0);
          raviX_buffer_add_string(mb,";\n");
          raviX_buffer_add_string(mb," TValue *dest_base = ");
          src.field_3.symbol = (LuaSymbol *)0x0;
          src.field_3.index_info.container = (Pseudo *)0x0;
          src.field_3.index_info.key = (Pseudo *)0x0;
          src.field_3._8_8_ = 0;
          src.field_3._16_8_ = 0;
          src._0_8_ = (ulong)((uVar25 & 0xffff) << 4) | 4;
          emit_reg_accessor(fn,&src,0);
          raviX_buffer_add_string(mb,";\n TValue *src = L->top-1;\n");
          raviX_buffer_add_string(mb," L->top = dest_base + (L->top-src_base);\n");
          raviX_buffer_add_string(mb," TValue *dest = L->top-1;\n");
          raviX_buffer_add_string(mb," while (src >= src_base) {\n");
          raviX_buffer_add_string(mb,"  dest->tt_ = src->tt_; dest->value_.gc = src->value_.gc;\n");
          raviX_buffer_add_string(mb,"  src--;\n");
          raviX_buffer_add_string(mb,"  dest--;\n");
          raviX_buffer_add_string(mb," }\n");
          raviX_buffer_add_string(mb,"}\n");
          uVar24 = (ulong)uVar26;
        }
      }
    }
    uVar26 = (uint)uVar24;
    uVar10 = ((uVar10 >> 4) + uVar26) * 0x10;
    while( true ) {
      uVar10 = uVar10 - 0x10;
      uVar26 = uVar26 - 1;
      if ((int)uVar26 < 0) break;
      src.field_3.symbol = (LuaSymbol *)0x0;
      src.field_3.index_info.container = (Pseudo *)0x0;
      src.field_3.index_info.key = (Pseudo *)0x0;
      src.field_3._8_8_ = 0;
      src.field_3._16_8_ = 0;
      src._0_8_ = (ulong)uVar10 & 0xffffffff000ffff0 | 4;
      pPVar15 = get_operand(insn,uVar26);
      emit_move(fn,pPVar15,&src);
    }
    if (bVar32) {
      raviX_buffer_add_string(mb," L->top = ");
      pPVar15 = get_target(insn,0);
      emit_reg_accessor(fn,pPVar15,0);
      raviX_buffer_add_fstring(mb," + %d;\n",uVar24);
    }
    raviX_buffer_add_string(mb,"{\n TValue *ra = ");
    pPVar15 = get_target(insn,0);
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_fstring
              (mb,";\n int result = luaD_precall(L, ra, %d, 1);\n",(ulong)ppBVar6 & 0xffffffff);
    raviX_buffer_add_string(mb," if (result) {\n");
    raviX_buffer_add_fstring(mb,"  if (result == 1 && %d >= 0)\n",(ulong)ppBVar6 & 0xffffffff);
    raviX_buffer_add_string(mb,"   L->top = ci->top;\n");
    raviX_buffer_add_string(mb," }\n");
    raviX_buffer_add_string(mb," else {  /* Lua function */\n");
    raviX_buffer_add_string(mb,"  result = luaV_execute(L);\n");
    raviX_buffer_add_string(mb,"  if (result) L->top = ci->top;\n");
    raviX_buffer_add_string(mb," }\n");
    pcVar21 = " base = ci->u.l.base;\n";
LAB_0011e08f:
    raviX_buffer_add_string(mb,pcVar21);
    goto LAB_0011e097;
  case 0x57:
  case 0x59:
    bVar32 = uVar26 == 0x57;
    pcVar21 = "lua_Number *";
    if (bVar32) {
      pcVar21 = "lua_Integer *";
    }
    pcVar29 = "setfltvalue";
    if (bVar32) {
      pcVar29 = "setivalue";
    }
    pPVar15 = get_operand(insn,0);
    pPVar16 = get_operand(insn,1);
    pPVar17 = get_target(insn,0);
    raviX_buffer_add_string(mb,"{\n");
    raviX_buffer_add_string(mb," RaviArray *arr = arrvalue(");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,");\n lua_Unsigned ukey = (lua_Unsigned) ");
    uVar26 = *(uint *)pPVar16 & 0xf;
    if (uVar26 == 0) {
      raviX_buffer_add_string(mb,"ivalue(");
      emit_reg_accessor(fn,pPVar16,0);
      raviX_buffer_add_string(mb,")");
    }
    else if (uVar26 == 2) {
      emit_varname(fn,pPVar16);
    }
    else {
      if (uVar26 != 5) {
LAB_0011e876:
        pcVar21 = "Unexpected key pseudo";
        goto LAB_0011e7e3;
      }
      raviX_buffer_add_fstring(mb,"%lld",((pPVar16->field_3).proc)->nodes);
    }
    raviX_buffer_add_string(mb,";\n");
    raviX_buffer_add_fstring(mb," %siptr = (%s)arr->data;\n ",pcVar21);
    uVar26 = *(uint *)pPVar17 & 0xf;
    if (uVar26 == bVar32 + 1) {
      emit_varname(fn,pPVar17);
      pcVar21 = " = iptr[ukey];\n";
      goto LAB_0011defd;
    }
    if ((0xd < uVar26) || ((0x2011U >> uVar26 & 1) == 0)) {
      pcVar21 = "Unexpected dest pseudo";
      goto LAB_0011e7e3;
    }
    raviX_buffer_add_string(mb,"TValue *dest_reg = ");
    emit_reg_accessor(fn,pPVar17,0);
    raviX_buffer_add_fstring(mb,"; %s(dest_reg, iptr[ukey]);\n",pcVar29);
    goto LAB_0011df05;
  case 0x5b:
    pPVar15 = get_first_operand(insn);
    raviX_buffer_add_string(mb,"{\n TValue *clsvar = ");
    emit_reg_accessor(fn,pPVar15,0);
    raviX_buffer_add_string(mb,";\n");
    pcVar21 = " luaF_close(L, clsvar, LUA_OK);\n";
LAB_0011d678:
    raviX_buffer_add_string(mb,pcVar21);
    emit_reload_base(fn);
    goto LAB_0011e097;
  case 0x5c:
    uVar10 = get_num_operands(insn);
    raviX_buffer_add_fstring
              (mb," if (stackoverflow(L,%d)) { luaD_growstack(L, %d); base = ci->u.l.base; }\n",
               (ulong)uVar10,(ulong)uVar10);
    raviX_buffer_add_string(mb,"{\n");
    uVar26 = (fn->proc->temp_pseudos).max_reg;
    uVar31 = uVar26 << 4;
    for (uVar25 = 0; uVar10 != uVar25; uVar25 = uVar25 + 1) {
      src.field_3.symbol = (LuaSymbol *)0x0;
      src.field_3.index_info.container = (Pseudo *)0x0;
      src.field_3.index_info.key = (Pseudo *)0x0;
      src.field_3._8_8_ = 0;
      src.field_3._16_8_ = 0;
      src._0_8_ = (ulong)uVar31 & 0xffffffff000ffff0 | 4;
      pPVar15 = get_operand(insn,uVar25);
      if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
        pPVar15 = raviX_allocate_range_select_pseudo(fn->proc,pPVar15,0);
      }
      emit_move(fn,pPVar15,&src);
      uVar31 = uVar31 + 0x10;
    }
    raviX_buffer_add_string(mb," L->top = ");
    src.field_3.symbol = (LuaSymbol *)0x0;
    src.field_3.index_info.container = (Pseudo *)0x0;
    src.field_3.index_info.key = (Pseudo *)0x0;
    src.field_3._8_8_ = 0;
    src.field_3._16_8_ = 0;
    uVar26 = (uVar26 & 0xffff) << 4;
    src._0_8_ = (ulong)uVar26 | 4;
    emit_reg_accessor(fn,&src,0);
    raviX_buffer_add_fstring(mb," + %d;\n",(ulong)uVar10);
    raviX_buffer_add_fstring(mb," luaV_concat(L, %d);\n",(ulong)uVar10);
    raviX_buffer_add_string(mb," base = ci->u.l.base;\n");
    raviX_buffer_add_string(mb," L->top = ci->top;\n");
    allocator.realloc = (_func_void_ptr_void_ptr_void_ptr_size_t *)0x0;
    allocator.create_arena = (_func_void_ptr_size_t_int *)0x0;
    allocator.destroy_arena = (_func_size_t_void_ptr *)0x0;
    allocator.calloc = (_func_void_ptr_void_ptr_size_t_size_t *)0x0;
    allocator.free = (_func_void_void_ptr_void_ptr *)0x0;
    allocator.arena = (void *)((ulong)uVar26 | 4);
    pPVar15 = get_target(insn,0);
    emit_move(fn,(Pseudo *)&allocator,pPVar15);
LAB_0011e097:
    pcVar21 = "}\n";
LAB_0011e09e:
    raviX_buffer_add_string(mb,pcVar21);
    return 0;
  case 0x5d:
    pPVar15 = get_first_target(insn);
    src.field_3.symbol = (LuaSymbol *)0x0;
    src.field_3.index_info.container = (Pseudo *)0x0;
    src.field_3.index_info.key = (Pseudo *)0x0;
    src.field_3._8_8_ = 0;
    src.field_3._16_8_ = 0;
    src._0_8_ = 7;
    uVar26 = *(uint *)pPVar15 & 0xf;
    if (uVar26 < 0xe) {
      if ((0x2011U >> uVar26 & 1) == 0) {
        if (((0xcU >> uVar26 & 1) == 0) && (uVar26 != 1)) goto LAB_0011e94e;
        src.field_3.symbol = (LuaSymbol *)&allocator;
        allocator.arena = (void *)0x8;
        allocator.realloc = (_func_void_ptr_void_ptr_void_ptr_size_t *)0x0;
        src._0_8_ = 5;
      }
      emit_move(fn,&src,pPVar15);
      return 0;
    }
LAB_0011e94e:
    handle_error_bad_pseudo(fn,pPVar15,"Unexpected pseudo");
  case 0x5e:
    saved.pos = (fn->body).pos;
    saved.buf = mb->buf;
    saved.capacity = (fn->body).capacity;
    mb->buf = (char *)0x0;
    (fn->body).capacity = 0;
    (fn->body).pos = 0;
    raviX_buffer_add_string(mb,"{\n");
    for (uVar26 = 0; uVar10 = get_num_operands(insn), uVar26 < uVar10; uVar26 = uVar26 + 1) {
      pPVar15 = get_operand(insn,uVar26);
      if ((*(uint *)pPVar15 & 0xf) - 1 < 2) {
        pPVar30 = (pPVar15->field_3).proc;
        if (pPVar30 == (Proc *)0x0) {
LAB_0011e80a:
          pcVar21 = "Unsupported pseudo type in C bind variables";
          goto LAB_0011e815;
        }
      }
      else {
        if ((*(uint *)pPVar15 & 0xf) != 0) goto LAB_0011e80a;
        pPVar30 = (pPVar15->field_3).proc;
      }
      iVar11 = *(int *)&pPVar30->nodes;
      if (iVar11 == 0x10) {
        pPVar23 = pPVar30->linearizer->all_procs;
        pcVar21 = " lua_Number %s = ";
LAB_0011c559:
        raviX_buffer_add_fstring(mb,pcVar21,pPVar23);
        emit_varname_or_constant(fn,pPVar15);
        pcVar21 = " ;\n";
      }
      else {
        if (iVar11 == 8) {
          pPVar23 = pPVar30->linearizer->all_procs;
          pcVar21 = " lua_Integer %s = ";
          goto LAB_0011c559;
        }
        pcVar21 = " Ravi_IntegerArray %s = {0};\n";
        if (iVar11 != 0x20) {
          if (iVar11 != -1) {
            pcVar21 = " Ravi_NumberArray %s = {0};\n";
            if (iVar11 == 0x40) goto LAB_0011c5b8;
            if ((iVar11 != 0x401) && (iVar11 != 0x101)) {
              pcVar21 = "Unsupported symbol type in C bind variable";
              goto LAB_0011e815;
            }
          }
          pcVar21 = " Ravi_StringOrUserData %s = {0};\n";
        }
LAB_0011c5b8:
        raviX_buffer_add_fstring(mb,pcVar21,pPVar30->linearizer->all_procs);
        raviX_buffer_add_string(mb," {\n");
        raviX_buffer_add_fstring(mb,"  TValue *raviX__%s = ",pPVar30->linearizer->all_procs);
        emit_reg_accessor(fn,(Pseudo *)pPVar30->current_scope,0);
        raviX_buffer_add_string(mb,";\n");
        if (iVar11 == 0x20) {
          pPVar23 = pPVar30->linearizer->all_procs;
          pcVar21 = "  %s.ptr = (lua_Integer*) arrvalue(raviX__%s)->data;\n";
LAB_0011c648:
          raviX_buffer_add_fstring(mb,pcVar21,pPVar23,pPVar23);
          raviX_buffer_add_fstring
                    (mb,"  %s.len = (unsigned int) arrvalue(raviX__%s)->len;\n",
                     pPVar30->linearizer->all_procs);
        }
        else {
          pPVar23 = pPVar30->linearizer->all_procs;
          if (iVar11 == 0x40) {
            pcVar21 = "  %s.ptr = (lua_Number *) arrvalue(raviX__%s)->data;\n";
            goto LAB_0011c648;
          }
          raviX_buffer_add_fstring(mb,"  if (ttisfulluserdata(raviX__%s)) {\n");
          raviX_buffer_add_fstring
                    (mb,"   %s.ptr = getudatamem(uvalue(raviX__%s));\n",
                     pPVar30->linearizer->all_procs);
          raviX_buffer_add_fstring
                    (mb,"   %s.len = (unsigned int) sizeudata(gco2u(raviX__%s));\n",
                     pPVar30->linearizer->all_procs);
          raviX_buffer_add_string(mb,"  }\n");
          raviX_buffer_add_fstring
                    (mb,"  else if (ttislightuserdata(raviX__%s)) {\n",
                     pPVar30->linearizer->all_procs);
          raviX_buffer_add_fstring
                    (mb,"   %s.ptr = pvalue(raviX__%s);\n",pPVar30->linearizer->all_procs);
          raviX_buffer_add_fstring(mb,"   %s.len = 0;\n",pPVar30->linearizer->all_procs);
          raviX_buffer_add_string(mb,"  }\n");
          raviX_buffer_add_fstring
                    (mb,"  else if (ttisstring(raviX__%s)) {\n",pPVar30->linearizer->all_procs);
          raviX_buffer_add_fstring
                    (mb,"   %s.ptr = svalue(raviX__%s);\n",pPVar30->linearizer->all_procs);
          raviX_buffer_add_fstring
                    (mb,"   %s.len = vslen(raviX__%s);\n",pPVar30->linearizer->all_procs);
          raviX_buffer_add_string(mb,"  }\n");
          raviX_buffer_add_string(mb,"  else {\n");
          raviX_buffer_add_fstring(mb,"   raviX__error_code = %d;\n",0x10);
          raviX_buffer_add_string(mb,"   goto Lraise_error;\n");
          raviX_buffer_add_string(mb,"  }\n");
        }
        pcVar21 = "  }\n";
      }
      raviX_buffer_add_string(mb,pcVar21 + 1);
    }
    pPVar15 = get_first_target(insn);
    if ((((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) != (undefined1  [48])0x5) ||
       (((pPVar15->field_3).constant)->type != 0x101)) {
      __assert_fail("C_code->type == PSEUDO_CONSTANT && C_code->constant->type == RAVI_TSTRING",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                    ,0xba3,"int emit_op_C__unsafe(Function *, Instruction *)");
    }
    raviX_buffer_add_string(mb," {\n");
    raviX_buffer_add_string(mb,(char *)((pPVar15->field_3).block)->insns->next_);
    raviX_buffer_add_string(mb," }\n");
    for (uVar26 = 0; uVar10 = get_num_operands(insn), uVar26 < uVar10; uVar26 = uVar26 + 1) {
      pPVar15 = get_operand(insn,uVar26);
      pPVar30 = (pPVar15->field_3).proc;
      iVar11 = *(int *)&pPVar30->nodes;
      if ((iVar11 == 0x10) || (iVar11 == 8)) {
        raviX_buffer_add_string(mb," {\n");
        raviX_buffer_add_string(mb,"  ");
        uVar10 = *(uint *)&pPVar30->current_scope->function & 0xf;
        if (uVar10 - 1 < 3) {
          emit_varname(fn,(Pseudo *)pPVar30->current_scope);
          raviX_buffer_add_string(mb," = ");
          pcVar21 = "%s;\n";
LAB_0011da7d:
          raviX_buffer_add_fstring(mb,pcVar21,pPVar30->linearizer->all_procs);
        }
        else if (uVar10 == 0) {
          raviX_buffer_add_string(mb," TValue *raviX__var = ");
          emit_reg_accessor(fn,(Pseudo *)pPVar30->current_scope,0);
          raviX_buffer_add_string(mb,";\n");
          pcVar21 = "setivalue(raviX__var, %s);\n";
          if (iVar11 != 8) {
            if (iVar11 != 0x10) {
              __assert_fail("type == RAVI_TNUMFLT",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/codegen.c"
                            ,0xb85,
                            "void emit_userdata_C_variable_store(Function *, Instruction *, Pseudo *)"
                           );
            }
            pcVar21 = "setfltvalue(raviX__var, %s);\n";
          }
          goto LAB_0011da7d;
        }
        raviX_buffer_add_string(mb," }\n");
      }
    }
    raviX_buffer_add_string(mb,"\n}\n");
    local_1d8.pos = (fn->body).pos;
    local_1d8.buf = mb->buf;
    local_1d8.capacity = (fn->body).capacity;
    mb->buf = saved.buf;
    (fn->body).capacity = saved.capacity;
    (fn->body).pos = saved.pos;
    raviX_buffer_init(&canned_code,0x400);
    raviX_buffer_add_string
              (&canned_code,
               "typedef long long int64_t;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef struct {\n   union { lua_Integer i; lua_Number n; } value_;\n} TValue;\nstatic lua_Integer ivalue(const TValue *v) { return 0; }\nstatic void setivalue(TValue *v, lua_Integer i) {}\nstatic lua_Number  fvalue(const TValue *v) { return 0.0; }\nstatic void setfltvalue(TValue *v, lua_Number f) {}\ntypedef struct {\n   char *data;\n   unsigned int len;\n} Ravi_Arr;\nstatic Ravi_Arr *arrvalue(const TValue *v) { return (Ravi_Arr *)v; }\nstatic int ttisfulluserdata(const TValue *v) { return 0; }\nstatic int ttislightuserdata(const TValue *v) { return 0; }\nstatic int ttisstring(const TValue *v) { return 0; }\nstatic void *uvalue(const TValue *v) { return (void*)0; }\nstatic void *pvalue(const TValue *v) { return (void*)0; }\nstatic void *svalue(const TValue *v) { return (void*)0; }\nstatic void *getudatamem(const TValue *v) { return (void*)0; }\nstatic void *gco2u(const TValue *v) { return (void*)0; }\nstatic unsigned int sizeudata(const void *p) { return 0; }\nstatic unsigned int vslen(const TValue *v) { return 0; }\nstatic void settt_(TValue *v, int tt) {}\nTValue *R(int reg) { return (void*)0; }\nstatic const int LUA_TNIL = 0;\nstatic const int LUA_TBOOLEAN = 1;\nstatic const int LUA_TLIGHTUSERDATA = 2;\nstatic const int LUA_TNUMBER = 3;\nstatic const int LUA_TSTRING = 4;\nstatic const int LUA_TTABLE = 5;\nstatic const int LUA_TFUNCTION = 6;\nstatic const int LUA_TUSERDATA = 7;\nstatic const int LUA_TTHREAD = 8;\ntypedef struct {\n   char *ptr;\n   unsigned int len;\n} Ravi_StringOrUserData;\ntypedef struct {\n  lua_Integer *ptr;\n  unsigned int len;\n} Ravi_IntegerArray;\ntypedef struct {\n  lua_Number *ptr;\n  unsigned int len;\n} Ravi_NumberArray;\nint raviX__error_code;\n"
              );
    raviX_buffer_add_string
              (&canned_code,
               "\nTValue ival0;\nTValue fval0;\nTValue bval0;\nTValue ival1;\nTValue fval1;\nTValue bval1;\nTValue ival2;\nTValue fval2;\nTValue bval2;\n"
              );
    pcVar21 = (fn->proc->linearizer->C_declarations).buf;
    if (pcVar21 != (char *)0x0) {
      raviX_buffer_add_string(&canned_code,pcVar21);
    }
    pcVar21 = (fn->C_local_declarations).buf;
    if (pcVar21 != (char *)0x0) {
      raviX_buffer_add_string(&canned_code,pcVar21);
    }
    pCVar4 = fn->proc->linearizer->compiler_state->allocator;
    allocator.arena = pCVar4->arena;
    allocator.realloc = pCVar4->realloc;
    allocator.calloc = pCVar4->calloc;
    allocator.free = pCVar4->free;
    allocator.create_arena = pCVar4->create_arena;
    allocator.destroy_arena = pCVar4->destroy_arena;
    allocator.arena = (*allocator.create_arena)(0,0);
    analysis.status = 0;
    C_parser_init((C_Parser *)&src,&allocator);
    pCVar12 = C_global_scope((C_Parser *)&src);
    pCVar13 = C_tokenize_buffer((C_Parser *)&src,canned_code.buf);
    if (pCVar13 != (C_Token *)0x0) {
      C_convert_pp_tokens((C_Parser *)&src,pCVar13);
      pCVar14 = C_parse(pCVar12,(C_Parser *)&src,pCVar13);
      if ((pCVar14 != (C_Obj *)0x0) &&
         (pCVar13 = C_tokenize_buffer((C_Parser *)&src,local_1d8.buf), pCVar13 != (C_Token *)0x0)) {
        C_convert_pp_tokens((C_Parser *)&src,pCVar13);
        node = C_parse_compound_statement(pCVar12,(C_Parser *)&src,pCVar13);
        if (node != (C_Node *)0x0) {
          walk_node(fn->api,&analysis,node);
          bVar9 = (byte)((uint)analysis.status >> 0x1f);
          goto LAB_0011dcd1;
        }
      }
    }
    analysis.status = -1;
    bVar9 = 1;
LAB_0011dcd1:
    if ((local_48 != (char *)0x0 & bVar9) == 1) {
      (*fn->api->error_message)(fn->api->context,local_48);
    }
    C_parser_destroy((C_Parser *)&src);
    (*allocator.destroy_arena)(allocator.arena);
    raviX_buffer_free(&canned_code);
    if (analysis.status == 0) {
      raviX_buffer_add_string(mb,local_1d8.buf);
      raviX_buffer_free(&local_1d8);
      return 0;
    }
    return -1;
  case 0x5f:
    pLVar3 = fn->proc->linearizer;
    raviX_buffer_init(&canned_code,0x400);
    raviX_buffer_add_string
              (&canned_code,
               "typedef long long int64_t;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef struct {\n   union { lua_Integer i; lua_Number n; } value_;\n} TValue;\nstatic lua_Integer ivalue(const TValue *v) { return 0; }\nstatic void setivalue(TValue *v, lua_Integer i) {}\nstatic lua_Number  fvalue(const TValue *v) { return 0.0; }\nstatic void setfltvalue(TValue *v, lua_Number f) {}\ntypedef struct {\n   char *data;\n   unsigned int len;\n} Ravi_Arr;\nstatic Ravi_Arr *arrvalue(const TValue *v) { return (Ravi_Arr *)v; }\nstatic int ttisfulluserdata(const TValue *v) { return 0; }\nstatic int ttislightuserdata(const TValue *v) { return 0; }\nstatic int ttisstring(const TValue *v) { return 0; }\nstatic void *uvalue(const TValue *v) { return (void*)0; }\nstatic void *pvalue(const TValue *v) { return (void*)0; }\nstatic void *svalue(const TValue *v) { return (void*)0; }\nstatic void *getudatamem(const TValue *v) { return (void*)0; }\nstatic void *gco2u(const TValue *v) { return (void*)0; }\nstatic unsigned int sizeudata(const void *p) { return 0; }\nstatic unsigned int vslen(const TValue *v) { return 0; }\nstatic void settt_(TValue *v, int tt) {}\nTValue *R(int reg) { return (void*)0; }\nstatic const int LUA_TNIL = 0;\nstatic const int LUA_TBOOLEAN = 1;\nstatic const int LUA_TLIGHTUSERDATA = 2;\nstatic const int LUA_TNUMBER = 3;\nstatic const int LUA_TSTRING = 4;\nstatic const int LUA_TTABLE = 5;\nstatic const int LUA_TFUNCTION = 6;\nstatic const int LUA_TUSERDATA = 7;\nstatic const int LUA_TTHREAD = 8;\ntypedef struct {\n   char *ptr;\n   unsigned int len;\n} Ravi_StringOrUserData;\ntypedef struct {\n  lua_Integer *ptr;\n  unsigned int len;\n} Ravi_IntegerArray;\ntypedef struct {\n  lua_Number *ptr;\n  unsigned int len;\n} Ravi_NumberArray;\nint raviX__error_code;\n"
              );
    raviX_buffer_add_string(&canned_code,(pLVar3->C_declarations).buf);
    pCVar4 = fn->proc->linearizer->compiler_state->allocator;
    allocator.arena = pCVar4->arena;
    allocator.realloc = pCVar4->realloc;
    allocator.calloc = pCVar4->calloc;
    allocator.free = pCVar4->free;
    allocator.create_arena = pCVar4->create_arena;
    allocator.destroy_arena = pCVar4->destroy_arena;
    allocator.arena = (*allocator.create_arena)(0,0);
    C_parser_init((C_Parser *)&src,&allocator);
    pCVar12 = C_global_scope((C_Parser *)&src);
    pCVar13 = C_tokenize_buffer((C_Parser *)&src,canned_code.buf);
    iVar11 = -1;
    if (pCVar13 == (C_Token *)0x0) goto LAB_0011e58a;
    C_convert_pp_tokens((C_Parser *)&src,pCVar13);
    pCVar14 = C_parse(pCVar12,(C_Parser *)&src,pCVar13);
    if (pCVar14 != (C_Obj *)0x0) {
      pPVar15 = get_operand(insn,0);
      pPVar16 = get_operand(insn,1);
      pPVar17 = get_target(insn,0);
      piVar18 = (int *)hashmap_get(&pCVar12->tags,(char *)((pPVar15->field_3).block)->insns->next_);
      if ((piVar18 != (int *)0x0) ||
         ((pvVar20 = hashmap_get(&pCVar12->vars,(char *)((pPVar15->field_3).block)->insns->next_),
          pvVar20 != (void *)0x0 && (piVar18 = *(int **)((long)pvVar20 + 8), piVar18 != (int *)0x0))
         )) {
        if (*piVar18 == 0xe) {
          piVar18 = piVar18 + 0x12;
          piVar8 = (int *)0x0;
          do {
            piVar28 = piVar8;
            piVar18 = *(int **)piVar18;
            piVar8 = piVar18;
          } while (piVar18 != (int *)0x0);
          if ((**(int **)(piVar28 + 2) != 0xc) || ((*(int **)(piVar28 + 2))[0xc] != 0))
          goto LAB_0011ce75;
        }
        else {
LAB_0011ce75:
          piVar28 = (int *)0x0;
        }
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb,"  TValue *raviX__elements = ");
        emit_reg_accessor(fn,pPVar16,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb,"  TValue *raviX__target = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb,"  if (ttisinteger(raviX__elements)) {\n");
        raviX_buffer_add_string(mb,"   lua_Integer n = ivalue(raviX__elements);\n");
        raviX_buffer_add_fstring(mb,"   size_t raviX__size = ");
        pIVar5 = ((pPVar15->field_3).block)->insns->next_;
        raviX_buffer_add_fstring(mb,"sizeof(%s)",pIVar5);
        if (piVar28 != (int *)0x0) {
          raviX_buffer_add_fstring
                    (mb," + (sizeof ((%s){0}).%.*s[0])",pIVar5,
                     (ulong)*(uint *)(*(long *)(piVar28 + 6) + 0x38),
                     *(undefined8 *)(*(long *)(piVar28 + 6) + 0x30));
        }
        raviX_buffer_add_fstring(mb,"* n;\n");
        raviX_buffer_add_fstring(mb,"   Udata *u = luaS_newudata(L, raviX__size);\n");
        raviX_buffer_add_string(mb,"   setuvalue(L, raviX__target, u);\n");
        raviX_buffer_add_string(mb,"  }\n");
        raviX_buffer_add_string(mb,"  else {\n");
        raviX_buffer_add_fstring(mb,"   raviX__error_code = %d;\n",0x10);
        raviX_buffer_add_string(mb,"   goto Lraise_error;\n");
        raviX_buffer_add_string(mb,"  }\n");
        raviX_buffer_add_string(mb,"}\n");
        iVar11 = 0;
        goto LAB_0011e58a;
      }
      raviX_buffer_init(&saved,0x80);
      raviX_buffer_add_fstring
                (&saved,"Unknown type \'%s\'",((pPVar15->field_3).block)->insns->next_);
      (*fn->api->error_message)(fn->api->context,saved.buf);
      raviX_buffer_free(&saved);
    }
    iVar11 = -1;
LAB_0011e58a:
    C_parser_destroy((C_Parser *)&src);
    (*allocator.destroy_arena)(allocator.arena);
    raviX_buffer_free(&canned_code);
    return iVar11;
  default:
    pcVar21 = raviX_opcode_name(uVar26);
    fprintf(__stream,"Unsupported opcode %s\n",pcVar21);
    return -1;
  }
  pPVar15 = get_first_target(insn);
  raviX_buffer_add_string(mb,"{\n");
  raviX_buffer_add_string(mb," TValue *ra = ");
  emit_reg_accessor(fn,pPVar15,0);
  raviX_buffer_add_string(mb,";\n TValue *rb = ");
  pPVar16 = get_operand(insn,0);
  emit_reg_accessor(fn,pPVar16,1);
  raviX_buffer_add_string(mb,";\n TValue *rc = ");
  pPVar16 = get_operand(insn,1);
  emit_reg_accessor(fn,pPVar16,2);
  raviX_buffer_add_fstring(mb,";\n luaO_arith(L, %d, rb, rc, ra);\n",uStack_270);
  emit_reload_base(fn);
  if ((*(uint *)pPVar15 & 0xf) - 1 < 3) {
    raviX_buffer_add_string(mb," ");
    emit_varname(fn,pPVar15);
    raviX_buffer_add_string(mb," = ");
    pcVar29 = " bvalue(ra);\n";
    if ((*(uint *)pPVar15 & 0xf) == 2) {
      pcVar29 = " ivalue(ra);\n";
    }
    pcVar21 = " fltvalue(ra);\n";
    if ((*(uint *)pPVar15 & 0xf) != 1) {
      pcVar21 = pcVar29;
    }
LAB_0011defd:
    raviX_buffer_add_string(mb,pcVar21);
  }
LAB_0011df05:
  pcVar21 = "}\n";
LAB_0011df0c:
  raviX_buffer_add_string(mb,pcVar21);
  return 0;
}

Assistant:

static int output_instruction(Function *fn, Instruction *insn)
{
	int rc = 0;

	// Output the IR instruction we are compiling
	raviX_buffer_reset(&fn->tb);
	raviX_output_instruction(insn, &fn->tb);
	raviX_buffer_add_fstring(&fn->body, "// %s\n", fn->tb.buf);
	raviX_buffer_reset(&fn->tb);

	switch (insn->opcode) {
	case op_ret:
		rc = emit_op_ret(fn, insn);
		break;
	case op_br:
		rc = emit_op_br(fn, insn);
		break;
	case op_cbr:
		rc = emit_op_cbr(fn, insn);
		break;
	case op_mov:
	case op_movi:
	case op_movf:
		rc = emit_op_mov(fn, insn);
		break;
	case op_movfi:
		rc = emit_op_movfi(fn, insn);
		break;
	case op_movif:
		rc = emit_op_movif(fn, insn);
		break;
	case op_loadglobal:
	case op_get:
	case op_get_skey:
	case op_get_ikey:
	case op_tget_skey:
	case op_tget_ikey:
	case op_tget: /* TODO custom codegen */
	case op_iaget:
	case op_faget:
		rc = emit_op_load_table(fn, insn);
		break;
	case op_storeglobal:
	case op_put:
	case op_put_skey:
	case op_put_ikey:
	case op_tput_skey:
	case op_tput_ikey:
	case op_tput: /* TODO custom codegen */
	case op_iaput:
	case op_faput:
		rc = emit_op_store_table(fn, insn);
		break;
	case op_call:
		rc = emit_op_call(fn, insn);
		break;

	case op_addff:
	case op_subff:
	case op_mulff:
	case op_divff:

	case op_addii:
	case op_subii:
	case op_mulii:
	case op_divii:
	case op_bandii:
	case op_borii:
	case op_bxorii:
		rc = emit_bin_ii(fn, insn);
		break;

	case op_shlii:
	case op_shrii:
		rc = emit_bitop_ii(fn, insn);
		break;

	case op_eqii:
	case op_ltii:
	case op_leii:
	case op_eqff:
	case op_ltff:
	case op_leff:
		rc = emit_comp_ii(fn, insn);
		break;

	case op_addfi:
	case op_subfi:
	case op_mulfi:
	case op_divfi:
		rc = emit_bin_fi(fn, insn);
		break;

	case op_subif:
	case op_divif:
		rc = emit_bin_if(fn, insn);
		break;

	case op_add:
	case op_sub:
	case op_mul:
		rc = emit_op_arith(fn, insn);
		break;

	case op_not:
		rc = emit_op_not(fn, insn);
		break;

	case op_bnot:
		rc = emit_op_bnot(fn, insn);
		break;

	case op_div:
	case op_idiv:
	case op_band:
	case op_bor:
	case op_bxor:
	case op_shl:
	case op_shr:
	case op_mod:
	case op_pow:
		rc = emit_op_binary(fn, insn);
		break;

	case op_unmi:
	case op_unmf:
		rc = emit_op_unmi_unmf(fn, insn);
		break;

	case op_unm:
		rc = emit_op_unm(fn, insn);
		break;

	case op_eq:
	case op_lt:
	case op_le:
		rc = emit_generic_comp(fn, insn);
		break;

	case op_iaget_ikey:
	case op_faget_ikey:
		rc = emit_op_arrayget_ikey(fn, insn);
		break;

	case op_iaput_ival:
	case op_faput_fval:
		rc = emit_op_arrayput_val(fn, insn);
		break;

	case op_toiarray:
	case op_tofarray:
	case op_totable:
	case op_tostring:
	case op_toclosure:
	case op_toint:
		rc = emit_op_totype(fn, insn);
		break;

	case op_toflt:
		rc = emit_op_toflt(fn, insn);
		break;

	case op_totype:
		rc = emit_op_tousertype(fn, insn);
		break;

	case op_closure:
		rc = emit_op_closure(fn, insn);
		break;

	case op_newtable:
		rc = emit_op_newtable(fn, insn);
		break;

	case op_newiarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_newfarray:
		rc = emit_op_newarray(fn, insn);
		break;

	case op_close:
		rc = emit_op_close(fn, insn);
		break;

	case op_len:
	case op_leni:
		rc = emit_op_len(fn, insn);
		break;

	case op_concat:
		rc = emit_op_concat(fn, insn);
		break;

	case op_init:
		rc = emit_op_init(fn, insn);
		break;

	case op_C__unsafe:
		rc = emit_op_C__unsafe(fn, insn);
		break;

	case op_C__new:
		rc = emit_op_C__new(fn, insn);
		break;

	default:
		fprintf(stderr, "Unsupported opcode %s\n", raviX_opcode_name(insn->opcode));
		rc = -1;
	}
	return rc;
}